

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O3

aiAnimation * __thiscall Assimp::Ogre::Animation::ConvertToAssimpAnimation(Animation *this)

{
  pointer pVVar1;
  pointer pVVar2;
  aiAnimation *paVar3;
  aiNodeAnim **ppaVar4;
  aiNodeAnim *paVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  paVar3 = (aiAnimation *)operator_new(0x448);
  (paVar3->mName).length = 0;
  (paVar3->mName).data[0] = '\0';
  memset((paVar3->mName).data + 1,0x1b,0x3ff);
  paVar3->mNumChannels = 0;
  paVar3->mChannels = (aiNodeAnim **)0x0;
  paVar3->mNumMeshChannels = 0;
  paVar3->mMeshChannels = (aiMeshAnim **)0x0;
  paVar3->mNumMorphMeshChannels = 0;
  paVar3->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
  uVar7 = (this->name)._M_string_length;
  if (uVar7 < 0x400) {
    (paVar3->mName).length = (ai_uint32)uVar7;
    memcpy((paVar3->mName).data,(this->name)._M_dataplus._M_p,uVar7);
    (paVar3->mName).data[uVar7] = '\0';
  }
  paVar3->mDuration = (double)this->length;
  paVar3->mTicksPerSecond = 1.0;
  pVVar1 = (this->tracks).
           super__Vector_base<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this->tracks).
           super__Vector_base<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar1 != pVVar2) {
    uVar7 = ((long)pVVar2 - (long)pVVar1 >> 4) * 0x6db6db6db6db6db7;
    paVar3->mNumChannels = (uint)uVar7;
    ppaVar4 = (aiNodeAnim **)operator_new__((uVar7 & 0xffffffff) << 3);
    paVar3->mChannels = ppaVar4;
    lVar8 = 0;
    lVar6 = 0;
    do {
      paVar5 = VertexAnimationTrack::ConvertToAssimpAnimationNode
                         ((VertexAnimationTrack *)
                          ((long)&((this->tracks).
                                   super__Vector_base<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->type + lVar8),
                          this->parentSkeleton);
      ppaVar4[lVar6] = paVar5;
      lVar6 = lVar6 + 1;
      lVar8 = lVar8 + 0x70;
    } while (uVar7 + (uVar7 == 0) != lVar6);
  }
  return paVar3;
}

Assistant:

aiAnimation *Animation::ConvertToAssimpAnimation()
{
    aiAnimation *anim = new aiAnimation();
    anim->mName = name;
    anim->mDuration = static_cast<double>(length);
    anim->mTicksPerSecond = 1.0;

    // Tracks
    if (!tracks.empty())
    {
        anim->mNumChannels = static_cast<unsigned int>(tracks.size());
        anim->mChannels = new aiNodeAnim*[anim->mNumChannels];

        for(size_t i=0, len=tracks.size(); i<len; ++i)
        {
            anim->mChannels[i] = tracks[i].ConvertToAssimpAnimationNode(parentSkeleton);
        }
    }
    return anim;
}